

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

bool __thiscall
google::protobuf::internal::ExtensionSet::FindExtensionInfoFromFieldNumber
          (ExtensionSet *this,int wire_type,int field_number,ExtensionFinder *extension_finder,
          ExtensionInfo *extension,bool *was_packed_on_wire)

{
  bool bVar1;
  uint uVar2;
  FieldType type;
  WireType type_00;
  WireType expected_wire_type;
  bool *was_packed_on_wire_local;
  ExtensionInfo *extension_local;
  ExtensionFinder *extension_finder_local;
  int field_number_local;
  int wire_type_local;
  ExtensionSet *this_local;
  
  uVar2 = (*extension_finder->_vptr_ExtensionFinder[2])
                    (extension_finder,(ulong)(uint)field_number,extension);
  if ((uVar2 & 1) == 0) {
    this_local._7_1_ = false;
  }
  else {
    type = anon_unknown_22::real_type(extension->type);
    type_00 = WireFormatLite::WireTypeForFieldType(type);
    *was_packed_on_wire = false;
    if ((((extension->is_repeated & 1U) == 0) || (wire_type != 2)) ||
       (bVar1 = anon_unknown_22::is_packable(type_00), !bVar1)) {
      this_local._7_1_ = type_00 == wire_type;
    }
    else {
      *was_packed_on_wire = true;
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ExtensionSet::FindExtensionInfoFromFieldNumber(
    int wire_type, int field_number, ExtensionFinder* extension_finder,
    ExtensionInfo* extension, bool* was_packed_on_wire) const {
  if (!extension_finder->Find(field_number, extension)) {
    return false;
  }

  WireFormatLite::WireType expected_wire_type =
      WireFormatLite::WireTypeForFieldType(real_type(extension->type));

  // Check if this is a packed field.
  *was_packed_on_wire = false;
  if (extension->is_repeated &&
      wire_type == WireFormatLite::WIRETYPE_LENGTH_DELIMITED &&
      is_packable(expected_wire_type)) {
    *was_packed_on_wire = true;
    return true;
  }
  // Otherwise the wire type must match.
  return expected_wire_type == wire_type;
}